

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::Arena::CallDestructorHooks(Arena *this)

{
  uint64 uVar1;
  
  uVar1 = (this->impl_).space_allocated_.super___atomic_base<unsigned_long>._M_i;
  if (this->on_arena_reset_ != (_func_void_Arena_ptr_void_ptr_uint64 *)0x0) {
    (*this->on_arena_reset_)(this,this->hooks_cookie_,uVar1);
  }
  if (this->on_arena_destruction_ != (_func_void_Arena_ptr_void_ptr_uint64 *)0x0) {
    (*this->on_arena_destruction_)(this,this->hooks_cookie_,uVar1);
    return;
  }
  return;
}

Assistant:

void Arena::CallDestructorHooks() {
  uint64 space_allocated = impl_.SpaceAllocated();
  // Call the reset hook
  if (on_arena_reset_ != NULL) {
    on_arena_reset_(this, hooks_cookie_, space_allocated);
  }

  // Call the destruction hook
  if (on_arena_destruction_ != NULL) {
    on_arena_destruction_(this, hooks_cookie_, space_allocated);
  }
}